

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_radix_tree.c
# Opt level: O3

uintptr_t ngx_radix32tree_find(ngx_radix_tree_t *tree,uint32_t key)

{
  uint uVar1;
  uintptr_t uVar2;
  ngx_radix_node_t *pnVar3;
  uint uVar4;
  
  pnVar3 = tree->root;
  if (pnVar3 != (ngx_radix_node_t *)0x0) {
    uVar4 = 0x80000000;
    uVar2 = 0xffffffffffffffff;
    do {
      if (pnVar3->value != 0xffffffffffffffff) {
        uVar2 = pnVar3->value;
      }
      uVar1 = uVar4 & key;
      uVar4 = uVar4 >> 1;
      pnVar3 = (&pnVar3->right)[uVar1 == 0];
    } while (pnVar3 != (ngx_radix_node_t *)0x0);
    return uVar2;
  }
  return 0xffffffffffffffff;
}

Assistant:

uintptr_t
ngx_radix32tree_find(ngx_radix_tree_t *tree, uint32_t key)
{
    uint32_t           bit;
    uintptr_t          value;
    ngx_radix_node_t  *node;

    bit = 0x80000000;
    value = NGX_RADIX_NO_VALUE;
    node = tree->root;

    while (node) {
        if (node->value != NGX_RADIX_NO_VALUE) {
            value = node->value;
        }

        if (key & bit) {
            node = node->right;

        } else {
            node = node->left;
        }

        bit >>= 1;
    }

    return value;
}